

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O0

void __thiscall Clasp::Cli::ClaspCliConfig::createOptions(ClaspCliConfig *this)

{
  OptionGroup *pOVar1;
  OptionInitHelper name;
  char *desc;
  ProgOption *val;
  ClaspCliConfig *this_00;
  OptionGroup *pOVar2;
  string cmdName;
  undefined4 in_stack_fffffffffffff178;
  State in_stack_fffffffffffff17c;
  Value *in_stack_fffffffffffff180;
  string *in_stack_fffffffffffff188;
  OptionGroup *in_stack_fffffffffffff190;
  undefined8 in_stack_fffffffffffff198;
  int iVar3;
  ClaspCliConfig *in_stack_fffffffffffff1a0;
  char *in_stack_fffffffffffff2d8;
  Value *in_stack_fffffffffffff2e0;
  char *in_stack_fffffffffffff2e8;
  OptionInitHelper *in_stack_fffffffffffff2f0;
  string local_68 [32];
  OptionGroup *local_48;
  undefined1 local_3d;
  allocator local_29;
  string local_28 [40];
  
  iVar3 = (int)((ulong)in_stack_fffffffffffff198 >> 0x20);
  pOVar1 = SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::get
                     ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
                      0x1333bb);
  if (pOVar1 == (OptionGroup *)0x0) {
    operator_new(0x40);
    local_3d = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"",&local_29);
    Potassco::ProgramOptions::OptionGroup::OptionGroup
              (in_stack_fffffffffffff190,in_stack_fffffffffffff188,
               (DescriptionLevel)((ulong)in_stack_fffffffffffff180 >> 0x20));
    local_3d = 0;
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator=
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               in_stack_fffffffffffff180,
               (OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x133480);
    local_48 = (OptionGroup *)
               Potassco::ProgramOptions::OptionGroup::addOptions
                         ((OptionGroup *)
                          CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::defaultsTo
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::Value::state(in_stack_fffffffffffff180,in_stack_fffffffffffff17c);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    std::__cxx11::string::string(local_68);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x13351f);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::defaultsTo
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::Value::state(in_stack_fffffffffffff180,in_stack_fffffffffffff17c);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x133612);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::flag(in_stack_fffffffffffff180);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x1336e2);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::Value::implicit
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x1337d7);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::implicit
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x1338cc);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::flag(in_stack_fffffffffffff180);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x13399c);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::flag(in_stack_fffffffffffff180);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x133a6c);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x133b43);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x133c1a);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x133cf1);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::flag(in_stack_fffffffffffff180);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x133dc1);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::implicit
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x133e98);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x133f6f);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::flag(in_stack_fffffffffffff180);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x13403f);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x134116);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x1341ed);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x1342c4);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::flag(in_stack_fffffffffffff180);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x134394);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::flag(in_stack_fffffffffffff180);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x134464);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::flag(in_stack_fffffffffffff180);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x134534);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x1345ed);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::flag(in_stack_fffffffffffff180);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x1346bd);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x134794);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::implicit
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x134889);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x134960);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x134a37);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::implicit
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x134b2c);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x134c03);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::flag(in_stack_fffffffffffff180);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x134cd3);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x134daa);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x134e81);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::implicit
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x134f76);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x13504d);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::flag(in_stack_fffffffffffff180);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x13511d);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::implicit
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x135212);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x1352e9);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x1353c0);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::implicit
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x135497);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x13556e);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x135645);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x13571c);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x1357f3);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x1358ca);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::flag(in_stack_fffffffffffff180);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x13599a);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x135a71);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x135b48);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x135c1f);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::defaultsTo
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::Value::state(in_stack_fffffffffffff180,in_stack_fffffffffffff17c);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x135d12);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x135dcb);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x135ea2);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::defaultsTo
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::Value::state(in_stack_fffffffffffff180,in_stack_fffffffffffff17c);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x135f95);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::Value::implicit
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x13608a);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x136161);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x13621a);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x1362f1);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x1363c8);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x13649f);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::flag(in_stack_fffffffffffff180);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x13656f);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::flag(in_stack_fffffffffffff180);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x13663f);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::flag(in_stack_fffffffffffff180);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x13670f);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::flag(in_stack_fffffffffffff180);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x1367df);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::flag(in_stack_fffffffffffff180);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x1368af);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::flag(in_stack_fffffffffffff180);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x13697f);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x136a56);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              (in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
               in_stack_fffffffffffff2d8);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    pOVar1 = SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
                       ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>
                         *)0x136b2d);
    name = Potassco::ProgramOptions::OptionGroup::addOptions
                     ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    desc = (char *)std::__cxx11::string::c_str();
    val = createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              ((OptionInitHelper *)pOVar1,(char *)name.owner_,&val->super_Value,desc);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x136c04);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::defaultsTo
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              ((OptionInitHelper *)pOVar1,(char *)name.owner_,&val->super_Value,desc);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x136cdb);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::defaultsTo
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::Value::state(in_stack_fffffffffffff180,in_stack_fffffffffffff17c);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              ((OptionInitHelper *)pOVar1,(char *)name.owner_,&val->super_Value,desc);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x136dce);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::defaultsTo
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::Value::state(in_stack_fffffffffffff180,in_stack_fffffffffffff17c);
    Potassco::ProgramOptions::OptionInitHelper::operator()
              ((OptionInitHelper *)pOVar1,(char *)name.owner_,&val->super_Value,desc);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x136ec1);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::Value::implicit
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              ((OptionInitHelper *)pOVar1,(char *)name.owner_,&val->super_Value,desc);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x136fb6);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              ((OptionInitHelper *)pOVar1,(char *)name.owner_,&val->super_Value,desc);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x137087);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              ((OptionInitHelper *)pOVar1,(char *)name.owner_,&val->super_Value,desc);
    keyToCliName(&in_stack_fffffffffffff190->caption_,(char *)in_stack_fffffffffffff188,
                 (char *)in_stack_fffffffffffff180);
    SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject> *)
               0x137140);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    std::__cxx11::string::c_str();
    createOption(in_stack_fffffffffffff1a0,iVar3);
    this_00 = (ClaspCliConfig *)
              Potassco::ProgramOptions::Value::arg
                        (in_stack_fffffffffffff180,
                         (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              ((OptionInitHelper *)pOVar1,(char *)name.owner_,&val->super_Value,desc);
    pOVar2 = SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>::operator->
                       ((SingleOwnerPtr<Potassco::ProgramOptions::OptionGroup,_Clasp::DeleteObject>
                         *)0x1371dc);
    iVar3 = (int)((ulong)pOVar2 >> 0x20);
    Potassco::ProgramOptions::OptionGroup::addOptions
              ((OptionGroup *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    createOption(this_00,iVar3);
    Potassco::ProgramOptions::Value::arg
              (in_stack_fffffffffffff180,
               (char *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178));
    Potassco::ProgramOptions::OptionInitHelper::operator()
              ((OptionInitHelper *)pOVar1,(char *)name.owner_,&val->super_Value,desc);
    std::__cxx11::string::~string(local_68);
  }
  return;
}

Assistant:

void ClaspCliConfig::createOptions() {
	if (opts_.get()) { return; }
	opts_ = new Options();
	using namespace Potassco::ProgramOptions;
	opts_->addOptions()("configuration", createOption(meta_config)->defaultsTo("auto")->state(Value::value_defaulted), KEY_INIT_DESC("Set default configuration [%D]\n"));
	std::string cmdName;
#define CLASP_ALL_GROUPS
#define OPTION(k, e, a, d, ...) keyToCliName(cmdName, #k, e); opts_->addOptions()(cmdName.c_str(),static_cast<ProgOption*>( createOption(opt_##k)a ), d);
#define ARG(a) ->a
#define ARG_EXT(a, X) ARG(a)
#define NO_ARG
#include <clasp/cli/clasp_cli_options.inl>
	opts_->addOptions()("tester", createOption(meta_tester)->arg("<options>"), "Pass (quoted) string of %A to tester");
}